

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

uint32_t __thiscall cfd::Psbt::AddTxIn(Psbt *this,OutPoint *outpoint,uint32_t sequence)

{
  uint32_t uVar1;
  Txid TStack_38;
  
  core::OutPoint::GetTxid(&TStack_38,outpoint);
  uVar1 = core::OutPoint::GetVout(outpoint);
  uVar1 = core::Psbt::AddTxIn(&this->super_Psbt,&TStack_38,uVar1,sequence);
  core::Txid::~Txid(&TStack_38);
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxIn(const OutPoint& outpoint, uint32_t sequence) {
  return cfd::core::Psbt::AddTxIn(
      outpoint.GetTxid(), outpoint.GetVout(), sequence);
}